

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int SaveEXRImageToFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  FILE *__stream;
  undefined8 *in_RCX;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t mem_size;
  uchar *mem;
  FILE *fp;
  char **in_stack_00000890;
  uchar **in_stack_00000898;
  EXRHeader *in_stack_000008a0;
  EXRImage *in_stack_000008a8;
  int local_4;
  
  if (((in_RDI == 0) || (in_RDX == (char *)0x0)) || (*(int *)(in_RSI + 0x10888) < 0)) {
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = "Invalid argument.";
    }
    local_4 = -3;
  }
  else if (*(int *)(in_RSI + 0x10888) == 0x80) {
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = "ZFP compression is not supported in this build.";
    }
    local_4 = 0;
  }
  else {
    __stream = fopen(in_RDX,"wb");
    if (__stream == (FILE *)0x0) {
      if (in_RCX != (undefined8 *)0x0) {
        *in_RCX = "Cannot write a file.";
      }
      local_4 = -6;
    }
    else {
      SaveEXRImageToMemory(in_stack_000008a8,in_stack_000008a0,in_stack_00000898,in_stack_00000890);
      free((void *)0x0);
      fclose(__stream);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int SaveEXRImageToFile(const EXRImage *exr_image, const EXRHeader *exr_header,
                       const char *filename, const char **err) {
  if (exr_image == NULL || filename == NULL ||
      exr_header->compression_type < 0) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#if !TINYEXR_USE_PIZ
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    if (err) {
      (*err) = "PIZ compression is not supported in this build.";
    }
    return 0;
  }
#endif

#if !TINYEXR_USE_ZFP
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    if (err) {
      (*err) = "ZFP compression is not supported in this build.";
    }
    return 0;
  }
#endif

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "wb");
#else
  FILE *fp = fopen(filename, "wb");
#endif
  if (!fp) {
    if (err) {
      (*err) = "Cannot write a file.";
    }
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveEXRImageToMemory(exr_image, exr_header, &mem, err);

  if ((mem_size > 0) && mem) {
    fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  return TINYEXR_SUCCESS;
}